

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall Parser::parse_statement(Parser *this,bool in_func)

{
  int iVar1;
  Type TVar2;
  pointer pTVar3;
  pointer pTVar4;
  AbstractSyntaxNode *pAVar5;
  char *pcVar6;
  ostream *poVar7;
  parser_exception *ppVar8;
  int iVar9;
  undefined7 in_register_00000031;
  Token *this_00;
  string local_288;
  TokenPosition local_268;
  Token local_250;
  Token local_1f8;
  stringstream buffer;
  ostream local_190 [376];
  
  _buffer = 0x28;
  pAVar5 = AbstractSyntaxNode::add_child
                     (this->current_,(Type *)&buffer,
                      (this->lookahead_).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                      super__Vector_impl_data._M_start + this->index_ % this->total_);
  this->current_ = pAVar5;
  std::__cxx11::stringstream::stringstream((stringstream *)&buffer);
  iVar9 = this->index_;
  iVar1 = this->total_;
  pTVar3 = (this->lookahead_).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((int)CONCAT71(in_register_00000031,in_func) == 0) {
    TVar2 = pTVar3[iVar9 % iVar1].type_;
    if (TVar2 == kIdentity) {
      if (pTVar3[(iVar9 + 1) % iVar1].type_ == kLeftParen) goto LAB_0013ad3c;
    }
    else if ((TVar2 - kRead < 4) || (TVar2 == kReturn)) {
LAB_0013ad3c:
      poVar7 = std::operator<<(local_190,"\"");
      pcVar6 = Token::token_type_name
                         (&(this->lookahead_).super__Vector_base<Token,_std::allocator<Token>_>.
                           _M_impl.super__Vector_impl_data._M_start[this->index_ % this->total_].
                           type_);
      poVar7 = std::operator<<(poVar7,pcVar6);
      std::operator<<(poVar7,anon_var_dwarf_77be4);
      ppVar8 = (parser_exception *)__cxa_allocate_exception(0x40);
      iVar9 = this->index_ % this->total_;
      pTVar3 = (this->lookahead_).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
               super__Vector_impl_data._M_start;
      pTVar4 = pTVar3 + iVar9;
      local_268.super_Position.row_ = (pTVar4->position_).super_Position.row_;
      local_268.super_Position.col_ = (pTVar4->position_).super_Position.col_;
      local_268.super_Position._vptr_Position = (_func_int **)&PTR_clear_001599f0;
      local_268.length_ = pTVar3[iVar9].position_.length_;
      std::__cxx11::stringbuf::str();
      parser_exception::parser_exception(ppVar8,&local_268,&local_288);
      __cxa_throw(ppVar8,&parser_exception::typeinfo,parser_exception::~parser_exception);
    }
  }
  TVar2 = pTVar3[iVar9 % iVar1].type_;
  switch(TVar2) {
  case kRead:
    parse_read_statement(this);
    break;
  case kWrite:
    parse_write_statement(this);
    break;
  case kWhile:
    parse_while_statement(this);
    break;
  case kIf:
    parse_if_statement(this);
    break;
  case kElse:
  case kInt:
  case kReal:
  case kVoid:
  case kFunc:
switchD_0013ad1a_caseD_5:
    if (TVar2 - kInt < 3) {
      parse_declare_statement(this);
      break;
    }
    if (TVar2 != kSemicolon) {
      poVar7 = std::operator<<(local_190,anon_var_dwarf_77bb8);
      Token::content_abi_cxx11_
                (&local_288,
                 (this->lookahead_).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                 super__Vector_impl_data._M_start + this->index_ % this->total_);
      poVar7 = std::operator<<(poVar7,(string *)&local_288);
      std::operator<<(poVar7,anon_var_dwarf_77bfa);
      std::__cxx11::string::~string((string *)&local_288);
      ppVar8 = (parser_exception *)__cxa_allocate_exception(0x40);
      iVar9 = this->index_ % this->total_;
      pTVar3 = (this->lookahead_).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
               super__Vector_impl_data._M_start;
      pTVar4 = pTVar3 + iVar9;
      local_268.super_Position.row_ = (pTVar4->position_).super_Position.row_;
      local_268.super_Position.col_ = (pTVar4->position_).super_Position.col_;
      local_268.super_Position._vptr_Position = (_func_int **)&PTR_clear_001599f0;
      local_268.length_ = pTVar3[iVar9].position_.length_;
      std::__cxx11::stringbuf::str();
      parser_exception::parser_exception(ppVar8,&local_268,&local_288);
      __cxa_throw(ppVar8,&parser_exception::typeinfo,parser_exception::~parser_exception);
    }
    local_288._M_dataplus._M_p._0_4_ = 0x11;
    match(&local_250,this,(Type *)&local_288);
    this_00 = &local_250;
    goto LAB_0013aea1;
  case kReturn:
    parse_return_statement(this);
    break;
  default:
    if (TVar2 != kIdentity) goto switchD_0013ad1a_caseD_5;
    if (pTVar3[(iVar9 + 1) % iVar1].type_ != kLeftParen) {
      parse_assign_statement(this);
      break;
    }
    parse_function_call(this);
    local_288._M_dataplus._M_p._0_4_ = 0x11;
    match(&local_1f8,this,(Type *)&local_288);
    this_00 = &local_1f8;
LAB_0013aea1:
    Token::~Token(this_00);
  }
  this->current_ = this->current_->parent_;
  std::__cxx11::stringstream::~stringstream((stringstream *)&buffer);
  return;
}

Assistant:

void Parser::parse_statement(bool in_func) {
    current_ = current_->add_child(Token::Type::kStatement, forward_token());
    std::stringstream buffer;

    if (!in_func && (forward_token().type() == Token::Type::kIf ||
                     forward_token().type() == Token::Type::kWhile ||
                     forward_token().type() == Token::Type::kRead ||
                     forward_token().type() == Token::Type::kWrite ||
                     (forward_token().type() == Token::Type::kIdentity && forward_token(2).type() == Token::Type::kLeftParen) ||
                     forward_token().type() == Token::Type::kReturn)) {
        buffer << "\"" << forward_token().type_name() << "\" 语句位于函数体外无效";
        throw parser_exception(forward_token().position(), buffer.str());
    }


    if (forward_token().type() == Token::Type::kIf) {
        parse_if_statement();
    } else if (forward_token().type() == Token::Type::kWhile) {
        parse_while_statement();
    } else if (forward_token().type() == Token::Type::kRead) {
        parse_read_statement();
    } else if (forward_token().type() == Token::Type::kWrite) {
        parse_write_statement();
    } else if (forward_token().type() == Token::Type::kIdentity && forward_token(2).type() != Token::Type::kLeftParen) {
        parse_assign_statement();
    } else if (forward_token().type() == Token::Type::kIdentity && forward_token(2).type() == Token::Type::kLeftParen) {
        parse_function_call();
        match(Token::Type::kSemicolon);
    } else if (forward_token().type() == Token::Type::kReturn) {
        parse_return_statement();
    } else if (is_declare_keyword(forward_token().type())) {
        parse_declare_statement();
    } else if (forward_token().type() == Token::Type::kSemicolon) {
        match(Token::Type::kSemicolon);
    } else {
        buffer << "无效的标识符 \"" << forward_token().content() << "\", 无法解析该语句, 请确认是否合法";
        throw parser_exception(forward_token().position(), buffer.str());
    }

    current_ = current_->parent();
}